

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O0

void __thiscall
MinVR::VRSpecificItemFactory<MinVR::VRInputDevice>::~VRSpecificItemFactory
          (VRSpecificItemFactory<MinVR::VRInputDevice> *this)

{
  VRItemFactory *in_RDI;
  
  in_RDI->_vptr_VRItemFactory = (_func_int **)&PTR__VRSpecificItemFactory_001bc6a8;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  VRItemFactory::~VRItemFactory(in_RDI);
  return;
}

Assistant:

virtual ~VRSpecificItemFactory() {}